

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall
Plan::DyndepsLoaded(Plan *this,DependencyScan *scan,Node *node,DyndepFile *ddf,string *err)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  bool bVar4;
  iterator iVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  pointer p_Var8;
  pointer __k;
  Edge *edge;
  vector<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>
  dyndep_roots;
  set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> dyndep_walk;
  key_type local_80;
  _Vector_base<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>
  local_78;
  _Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_std::less<Edge_*>,_std::allocator<Edge_*>_>
  local_60;
  
  bVar3 = RefreshDyndepDependents(this,scan,node,err);
  if (bVar3) {
    local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var1 = &(this->want_)._M_t._M_impl.super__Rb_tree_header;
    for (local_60._M_impl._0_8_ =
              (ddf->
              super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
              )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)local_60._M_impl._0_8_ !=
        &(ddf->
         super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
         )._M_t._M_impl.super__Rb_tree_header;
        local_60._M_impl._0_8_ =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_60._M_impl._0_8_)) {
      local_80 = *(key_type *)(local_60._M_impl._0_8_ + 0x20);
      if ((local_80->outputs_ready_ == false) &&
         (iVar5 = std::
                  _Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
                  ::find((_Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
                          *)this,&local_80), (_Rb_tree_header *)iVar5._M_node != p_Var1)) {
        std::
        vector<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>
        ::push_back((vector<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>
                     *)&local_78,(value_type *)&local_60);
      }
    }
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var8 = local_78._M_impl.super__Vector_impl_data._M_start;
        p_Var8 != local_78._M_impl.super__Vector_impl_data._M_finish; p_Var8 = p_Var8 + 1) {
      p_Var2 = p_Var8->_M_node;
      for (p_Var7 = p_Var2[1]._M_left; p_Var7 != p_Var2[1]._M_right;
          p_Var7 = (_Base_ptr)&p_Var7->_M_parent) {
        bVar3 = AddSubTarget(this,*(Node **)p_Var7,
                             (Node *)**(undefined8 **)(*(long *)(p_Var2 + 1) + 0x28),err,
                             (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)&local_60);
        if ((!bVar3) && (err->_M_string_length != 0)) {
          bVar3 = false;
          goto LAB_0010b13b;
        }
      }
    }
    for (__k = (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
               super__Vector_impl_data._M_start;
        p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left,
        __k != (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
               super__Vector_impl_data._M_finish; __k = __k + 1) {
      iVar5 = std::
              _Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
              ::find((_Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
                      *)this,__k);
      if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
        std::_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>::
        _M_insert_unique<Edge*const&>
                  ((_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>
                    *)&local_60,(Edge **)(iVar5._M_node + 1));
      }
    }
    while ((bVar3 = (_Rb_tree_header *)p_Var6 == &local_60._M_impl.super__Rb_tree_header, !bVar3 &&
           ((iVar5 = std::
                     _Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
                     ::find((_Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
                             *)this,(key_type *)(p_Var6 + 1)),
            (_Rb_tree_header *)iVar5._M_node == p_Var1 ||
            (bVar4 = EdgeMaybeReady(this,(iterator)iVar5._M_node,err), bVar4))))) {
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    }
LAB_0010b13b:
    std::
    _Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_std::less<Edge_*>,_std::allocator<Edge_*>_>::
    ~_Rb_tree(&local_60);
    std::
    _Vector_base<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>
    ::~_Vector_base(&local_78);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Plan::DyndepsLoaded(DependencyScan* scan, const Node* node,
                         const DyndepFile& ddf, string* err) {
  // Recompute the dirty state of all our direct and indirect dependents now
  // that our dyndep information has been loaded.
  if (!RefreshDyndepDependents(scan, node, err))
    return false;

  // We loaded dyndep information for those out_edges of the dyndep node that
  // specify the node in a dyndep binding, but they may not be in the plan.
  // Starting with those already in the plan, walk newly-reachable portion
  // of the graph through the dyndep-discovered dependencies.

  // Find edges in the the build plan for which we have new dyndep info.
  std::vector<DyndepFile::const_iterator> dyndep_roots;
  for (DyndepFile::const_iterator oe = ddf.begin(); oe != ddf.end(); ++oe) {
    Edge* edge = oe->first;

    // If the edge outputs are ready we do not need to consider it here.
    if (edge->outputs_ready())
      continue;

    map<Edge*, Want>::iterator want_e = want_.find(edge);

    // If the edge has not been encountered before then nothing already in the
    // plan depends on it so we do not need to consider the edge yet either.
    if (want_e == want_.end())
      continue;

    // This edge is already in the plan so queue it for the walk.
    dyndep_roots.push_back(oe);
  }

  // Walk dyndep-discovered portion of the graph to add it to the build plan.
  std::set<Edge*> dyndep_walk;
  for (std::vector<DyndepFile::const_iterator>::iterator
       oei = dyndep_roots.begin(); oei != dyndep_roots.end(); ++oei) {
    DyndepFile::const_iterator oe = *oei;
    for (vector<Node*>::const_iterator i = oe->second.implicit_inputs_.begin();
         i != oe->second.implicit_inputs_.end(); ++i) {
      if (!AddSubTarget(*i, oe->first->outputs_[0], err, &dyndep_walk) &&
          !err->empty())
        return false;
    }
  }

  // Add out edges from this node that are in the plan (just as
  // Plan::NodeFinished would have without taking the dyndep code path).
  for (vector<Edge*>::const_iterator oe = node->out_edges().begin();
       oe != node->out_edges().end(); ++oe) {
    map<Edge*, Want>::iterator want_e = want_.find(*oe);
    if (want_e == want_.end())
      continue;
    dyndep_walk.insert(want_e->first);
  }

  // See if any encountered edges are now ready.
  for (set<Edge*>::iterator wi = dyndep_walk.begin();
       wi != dyndep_walk.end(); ++wi) {
    map<Edge*, Want>::iterator want_e = want_.find(*wi);
    if (want_e == want_.end())
      continue;
    if (!EdgeMaybeReady(want_e, err))
      return false;
  }

  return true;
}